

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O3

psa_status_t
psa_its_set(psa_storage_uid_t uid,uint32_t data_length,void *p_data,
           psa_storage_create_flags_t create_flags)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  psa_status_t pVar3;
  psa_its_file_header_t header;
  char filename [25];
  undefined8 local_58;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  char local_48 [40];
  
  local_58 = 0x53544900415350;
  local_50 = (undefined1)data_length;
  local_4f = (undefined1)(data_length >> 8);
  local_4e = (undefined1)(data_length >> 0x10);
  local_4d = (undefined1)(data_length >> 0x18);
  local_4c = (undefined1)create_flags;
  local_4b = (undefined1)(create_flags >> 8);
  local_4a = (undefined1)(create_flags >> 0x10);
  local_49 = (undefined1)(create_flags >> 0x18);
  snprintf(local_48,0x19,"%s%08lx%08lx%s",anon_var_dwarf_2abed + 9,uid >> 0x20,uid & 0xffffffff,
           ".psa_its");
  __s = fopen("tempfile.psa_its","wb");
  if (__s == (FILE *)0x0) {
    pVar3 = -0x92;
  }
  else {
    sVar2 = fwrite(&local_58,1,0x10,__s);
    if ((sVar2 == 0x10) &&
       ((data_length == 0 || (sVar2 = fwrite(p_data,1,(ulong)data_length,__s), sVar2 == data_length)
        ))) {
      iVar1 = fclose(__s);
      pVar3 = -0x8e;
      if (iVar1 == 0) {
        iVar1 = rename("tempfile.psa_its",local_48);
        pVar3 = -0x92;
        if (iVar1 == 0) {
          pVar3 = 0;
        }
      }
    }
    else {
      fclose(__s);
      pVar3 = -0x8e;
    }
  }
  remove("tempfile.psa_its");
  return pVar3;
}

Assistant:

psa_status_t psa_its_set( psa_storage_uid_t uid,
                          uint32_t data_length,
                          const void *p_data,
                          psa_storage_create_flags_t create_flags )
{
    psa_status_t status = PSA_ERROR_STORAGE_FAILURE;
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    FILE *stream = NULL;
    psa_its_file_header_t header;
    size_t n;

    memcpy( header.magic, PSA_ITS_MAGIC_STRING, PSA_ITS_MAGIC_LENGTH );
    header.size[0] = data_length & 0xff;
    header.size[1] = ( data_length >> 8 ) & 0xff;
    header.size[2] = ( data_length >> 16 ) & 0xff;
    header.size[3] = ( data_length >> 24 ) & 0xff;
    header.flags[0] = create_flags & 0xff;
    header.flags[1] = ( create_flags >> 8 ) & 0xff;
    header.flags[2] = ( create_flags >> 16 ) & 0xff;
    header.flags[3] = ( create_flags >> 24 ) & 0xff;

    psa_its_fill_filename( uid, filename );
    stream = fopen( PSA_ITS_STORAGE_TEMP, "wb" );
    if( stream == NULL )
        goto exit;

    status = PSA_ERROR_INSUFFICIENT_STORAGE;
    n = fwrite( &header, 1, sizeof( header ), stream );
    if( n != sizeof( header ) )
        goto exit;
    if( data_length != 0 )
    {
        n = fwrite( p_data, 1, data_length, stream );
        if( n != data_length )
            goto exit;
    }
    status = PSA_SUCCESS;

exit:
    if( stream != NULL )
    {
        int ret = fclose( stream );
        if( status == PSA_SUCCESS && ret != 0 )
            status = PSA_ERROR_INSUFFICIENT_STORAGE;
    }
    if( status == PSA_SUCCESS )
    {
        if( rename_replace_existing( PSA_ITS_STORAGE_TEMP, filename ) != 0 )
            status = PSA_ERROR_STORAGE_FAILURE;
    }
    remove( PSA_ITS_STORAGE_TEMP );
    return( status );
}